

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token * __thiscall czh::lexer::Lexer::get(Token *__return_storage_ptr__,Lexer *this)

{
  Token local_118;
  Token local_b8;
  undefined1 local_68 [8];
  Token t;
  Lexer *this_local;
  
  t.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  czh::token::Token::Token((Token *)local_68,&this->buffer);
  if (local_68._0_4_ == UNEXPECTED) {
    get_tok(&local_b8,this);
    czh::token::Token::operator=((Token *)local_68,&local_b8);
    czh::token::Token::~Token(&local_b8);
    check_token(this,(Token *)local_68);
    this->is_eof = local_68._0_4_ == FEND;
  }
  get_tok(&local_118,this);
  czh::token::Token::operator=(&this->buffer,&local_118);
  czh::token::Token::~Token(&local_118);
  check_token(this,&this->buffer);
  this->is_eof = (this->buffer).type == FEND;
  czh::token::Token::Token(__return_storage_ptr__,(Token *)local_68);
  czh::token::Token::~Token((Token *)local_68);
  return __return_storage_ptr__;
}

Assistant:

token::Token get()
    {
      token::Token t = std::move(buffer);
      if (t.type == token::TokenType::UNEXPECTED)
      {
        t = std::move(get_tok());
        check_token(t);
        is_eof = (t.type == token::TokenType::FEND);
      }
      buffer = std::move(get_tok());
      check_token(buffer);
      is_eof = (buffer.type == token::TokenType::FEND);
      return std::move(t);
    }